

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     Combine<duckdb::ArgMinMaxState<long,int>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
               (Vector *source,Vector *target,AggregateInputData *aggr_input_data,idx_t count)

{
  ArgMinMaxState<long,_int> *source_00;
  ArgMinMaxState<long,_int> *in_RCX;
  idx_t i;
  ArgMinMaxState<long,_int> **tdata;
  ArgMinMaxState<long,_int> **sdata;
  ArgMinMaxState<long,_int> *target_00;
  
  FlatVector::GetData<duckdb::ArgMinMaxState<long,int>const*>((Vector *)0x1bc5502);
  source_00 = (ArgMinMaxState<long,_int> *)
              FlatVector::GetData<duckdb::ArgMinMaxState<long,int>*>((Vector *)0x1bc5511);
  for (target_00 = (ArgMinMaxState<long,_int> *)0x0; target_00 < in_RCX;
      target_00 = (ArgMinMaxState<long,_int> *)&(target_00->super_ArgMinMaxStateBase).arg_null) {
    ArgMinMaxBase<duckdb::GreaterThan,true>::
    Combine<duckdb::ArgMinMaxState<long,int>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
              (source_00,target_00,(AggregateInputData *)0x1bc554d);
  }
  return;
}

Assistant:

static void Combine(Vector &source, Vector &target, AggregateInputData &aggr_input_data, idx_t count) {
		D_ASSERT(source.GetType().id() == LogicalTypeId::POINTER && target.GetType().id() == LogicalTypeId::POINTER);
		auto sdata = FlatVector::GetData<const STATE_TYPE *>(source);
		auto tdata = FlatVector::GetData<STATE_TYPE *>(target);

		for (idx_t i = 0; i < count; i++) {
			OP::template Combine<STATE_TYPE, OP>(*sdata[i], *tdata[i], aggr_input_data);
		}
	}